

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::SerializeToCodedStream(MessageLite *this,CodedOutputStream *output)

{
  bool bVar1;
  char *message;
  string_view action;
  LogMessageFatal local_40 [16];
  string local_30;
  
  bVar1 = IsInitialized(this);
  if (bVar1) {
    bVar1 = SerializePartialToCodedStream(this,output);
    return bVar1;
  }
  message = "IsInitialized()";
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_40,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/message_lite.cc"
             ,0x1ee,0xf);
  action._M_str = (char *)this;
  action._M_len = (size_t)"serialize";
  (anonymous_namespace)::InitializationErrorMessage_abi_cxx11_
            (&local_30,(_anonymous_namespace_ *)0x9,action,(MessageLite *)message);
  absl::lts_20240722::log_internal::LogMessage::operator<<
            ((LogMessage *)local_40,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
}

Assistant:

bool MessageLite::SerializeToCodedStream(io::CodedOutputStream* output) const {
  ABSL_DCHECK(IsInitialized())
      << InitializationErrorMessage("serialize", *this);
  return SerializePartialToCodedStream(output);
}